

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 c_v64_ziplo_16(c_v64 a,c_v64 b)

{
  return (c_v64)(b.u64 & 0xffff | CONCAT44(a.u32[0],a.u32[0] << 0x10) & 0xffff0000ffffffff |
                (ulong)(b.u32[0] & 0xffff0000) << 0x10);
}

Assistant:

SIMD_INLINE c_v64 _c_v64_zip_16(c_v64 a, c_v64 b, int mode) {
  c_v64 t;
  if (mode) {
    t.u16[3] = a.u16[3];
    t.u16[2] = b.u16[3];
    t.u16[1] = a.u16[2];
    t.u16[0] = b.u16[2];
  } else {
    t.u16[3] = a.u16[1];
    t.u16[2] = b.u16[1];
    t.u16[1] = a.u16[0];
    t.u16[0] = b.u16[0];
  }
  return t;
}